

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumSerializers.hpp
# Opt level: O2

XMLNodeAdapter *
BSDFData::operator>>(XMLNodeAdapter *node,WavelengthDataDirection *wavelengthDataDirection)

{
  XMLNodeAdapter *pXVar1;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = WavelengthDataDirectionFromString;
  local_10 = std::
             _Function_handler<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthDataDirection_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthDataDirection_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
             ::_M_manager;
  pXVar1 = FileParse::deserializeEnum<XMLNodeAdapter,BSDFData::WavelengthDataDirection>
                     (node,wavelengthDataDirection,
                      (function<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return pXVar1;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::WavelengthDataDirection & wavelengthDataDirection)
    {
        return FileParse::deserializeEnum<NodeAdapter, WavelengthDataDirection>(
          node, wavelengthDataDirection, WavelengthDataDirectionFromString);
    }